

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer.h
# Opt level: O2

void __thiscall
google::protobuf::io::Printer::Sub::
Sub<google::protobuf::compiler::cpp::MessageGenerator::GenerateClassData(google::protobuf::io::Printer*)::__4_const&>
          (Sub *this,string *key,anon_class_16_2_fd512ddd_for_cb_conflict1 *value)

{
  Printer **ppPVar1;
  _Any_data local_48;
  code *local_38;
  code *pcStack_30;
  
  std::__cxx11::string::string((string *)this,(string *)key);
  local_38 = (code *)0x0;
  pcStack_30 = (code *)0x0;
  local_48._M_unused._M_object = (void *)0x0;
  local_48._8_8_ = 0;
  local_48._M_unused._M_object = operator_new(0x18);
  ppPVar1 = value->p;
  *(MessageGenerator **)local_48._M_unused._0_8_ = value->this;
  *(Printer ***)((long)local_48._M_unused._0_8_ + 8) = ppPVar1;
  *(code *)((long)local_48._M_unused._0_8_ + 0x10) = (code)0x0;
  pcStack_30 = std::
               _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
               ::_M_invoke;
  local_38 = std::
             _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
             ::_M_manager;
  std::variant<std::__cxx11::string,std::function<bool()>>::
  variant<std::function<bool()>,void,void,std::function<bool()>,void>
            ((variant<std::__cxx11::string,std::function<bool()>> *)&this->value_,
             (function<bool_()> *)&local_48);
  std::_Function_base::~_Function_base((_Function_base *)&local_48);
  (this->value_).consume_after._M_dataplus._M_p = (pointer)&(this->value_).consume_after.field_2;
  (this->value_).consume_after._M_string_length = 0;
  (this->value_).consume_after.field_2._M_local_buf[0] = '\0';
  (this->value_).consume_parens_if_empty = false;
  if (*(__index_type *)
       ((long)&(this->value_).value.
               super__Variant_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>
               .super__Move_assign_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>.
               super__Copy_assign_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>.
               super__Move_ctor_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>.
               super__Copy_ctor_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_> +
       0x20) == '\x01') {
    std::__cxx11::string::assign((char *)&(this->value_).consume_after);
  }
  (this->annotation_).
  super__Optional_base<google::protobuf::io::Printer::AnnotationRecord,_false,_false>._M_payload.
  super__Optional_payload<google::protobuf::io::Printer::AnnotationRecord,_true,_false,_false>.
  super__Optional_payload_base<google::protobuf::io::Printer::AnnotationRecord>._M_engaged = false;
  return;
}

Assistant:

Sub(std::string key, Value&& value)
      : key_(std::move(key)),
        value_(std::forward<Value>(value)),
        annotation_(absl::nullopt) {}